

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_reduceIndex(ZSTD_CCtx *zc,U32 reducerValue)

{
  ZSTD_strategy ZVar1;
  U32 UVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  U32 *table;
  long lVar7;
  uint uVar8;
  
  ZSTD_reduceTable((zc->blockState).matchState.hashTable,
                   1 << ((byte)(zc->appliedParams).cParams.hashLog & 0x1f),reducerValue);
  ZVar1 = (zc->appliedParams).cParams.strategy;
  if (ZVar1 != ZSTD_fast) {
    UVar2 = 1 << ((byte)(zc->appliedParams).cParams.chainLog & 0x1f);
    table = (zc->blockState).matchState.chainTable;
    if (ZVar1 == ZSTD_btlazy2) {
      iVar4 = 0x10;
      iVar3 = (int)UVar2 / 0x10;
      lVar5 = 0;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      for (iVar6 = 0; iVar6 != iVar3; iVar6 = iVar6 + 1) {
        for (lVar7 = 0; iVar4 + lVar5 != lVar7; lVar7 = lVar7 + 1) {
          UVar2 = reducerValue;
          if (table[lVar7] != 1) {
            UVar2 = 0;
          }
          uVar8 = UVar2 + table[lVar7];
          UVar2 = uVar8 - reducerValue;
          if (uVar8 < reducerValue) {
            UVar2 = 0;
          }
          table[lVar7] = UVar2;
        }
        table = table + 0x10;
        lVar5 = lVar5 + -0x10;
        iVar4 = iVar4 + 0x10;
      }
    }
    else {
      ZSTD_reduceTable(table,UVar2,reducerValue);
    }
  }
  UVar2 = (zc->blockState).matchState.hashLog3;
  if (UVar2 != 0) {
    ZSTD_reduceTable((zc->blockState).matchState.hashTable3,1 << ((byte)UVar2 & 0x1f),reducerValue);
    return;
  }
  return;
}

Assistant:

static void ZSTD_reduceIndex (ZSTD_CCtx* zc, const U32 reducerValue)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    {   U32 const hSize = (U32)1 << zc->appliedParams.cParams.hashLog;
        ZSTD_reduceTable(ms->hashTable, hSize, reducerValue);
    }

    if (zc->appliedParams.cParams.strategy != ZSTD_fast) {
        U32 const chainSize = (U32)1 << zc->appliedParams.cParams.chainLog;
        if (zc->appliedParams.cParams.strategy == ZSTD_btlazy2)
            ZSTD_reduceTable_btlazy2(ms->chainTable, chainSize, reducerValue);
        else
            ZSTD_reduceTable(ms->chainTable, chainSize, reducerValue);
    }

    if (ms->hashLog3) {
        U32 const h3Size = (U32)1 << ms->hashLog3;
        ZSTD_reduceTable(ms->hashTable3, h3Size, reducerValue);
    }
}